

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

Item * __thiscall WorldShuffler::randomize_fortune_teller_hint(WorldShuffler *this)

{
  RandomizerWorld *pRVar1;
  initializer_list<unsigned_char> __l;
  bool bVar2;
  HintSource *pHVar3;
  reference puVar4;
  WorldShuffler *item;
  WorldShuffler *pWVar5;
  ostream *poVar6;
  uint8_t local_2a1;
  string local_2a0;
  string local_280;
  stringstream local_260 [8];
  stringstream fortune_teller_hint;
  ostream local_250 [376];
  undefined1 local_d8 [8];
  string item_fancy_name;
  Item *hinted_item;
  iterator local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hintable_items;
  allocator<char> local_41;
  string local_40;
  HintSource *local_20;
  HintSource *fortune_teller_source;
  WorldShuffler *this_local;
  
  fortune_teller_source = (HintSource *)this;
  bVar2 = RandomizerOptions::archipelago_world(this->_options);
  if (bVar2) {
    this_local = (WorldShuffler *)0x0;
  }
  else {
    pRVar1 = this->_world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Mercator fortune teller",&local_41);
    pHVar3 = RandomizerWorld::hint_source(pRVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    local_20 = pHVar3;
    RandomizerWorld::add_used_hint_source(this->_world,pHVar3);
    HintSource::text_abi_cxx11_
              ((string *)
               &hintable_items.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_20);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &hintable_items.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &hintable_items.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      hinted_item._4_1_ = 0x2b;
      hinted_item._5_1_ = 0x37;
      hinted_item._6_1_ = 0x39;
      hinted_item._7_1_ = 0x38;
      local_a0 = (iterator)((long)&hinted_item + 4);
      local_98 = 4;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&hinted_item + 3))
      ;
      __l._M_len = local_98;
      __l._M_array = local_a0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,__l,
                 (allocator<unsigned_char> *)((long)&hinted_item + 3));
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)((long)&hinted_item + 3));
      vectools::shuffle<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,&this->_rng);
      pRVar1 = this->_world;
      item_fancy_name.field_2._8_8_ =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)((long)&item_fancy_name.field_2 + 8));
      item = (WorldShuffler *)World::item(&pRVar1->super_World,*puVar4);
      std::__cxx11::string::string((string *)local_d8);
      pWVar5 = (WorldShuffler *)World::item(&this->_world->super_World,'+');
      if (item == pWVar5) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   "an eye");
      }
      else {
        pWVar5 = (WorldShuffler *)World::item(&this->_world->super_World,'7');
        if (item == pWVar5) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     "a nail");
        }
        else {
          pWVar5 = (WorldShuffler *)World::item(&this->_world->super_World,'9');
          if (item == pWVar5) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                      "a fang");
          }
          else {
            pWVar5 = (WorldShuffler *)World::item(&this->_world->super_World,'8');
            if (item == pWVar5) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_d8,"a horn");
            }
          }
        }
      }
      std::__cxx11::stringstream::stringstream(local_260);
      poVar6 = std::operator<<(local_250,"\x1cI see... \x1aI see... \x1a\nI see ");
      poVar6 = std::operator<<(poVar6,(string *)local_d8);
      poVar6 = std::operator<<(poVar6," ");
      random_hint_for_item_abi_cxx11_(&local_280,this,(Item *)item);
      poVar6 = std::operator<<(poVar6,(string *)&local_280);
      std::operator<<(poVar6,".");
      std::__cxx11::string::~string((string *)&local_280);
      pHVar3 = local_20;
      std::__cxx11::stringstream::str();
      HintSource::text(pHVar3,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      local_2a1 = Item::id((Item *)item);
      vectools::erase_first<unsigned_char>(&this->_hintable_item_locations,&local_2a1);
      this_local = item;
      std::__cxx11::stringstream::~stringstream(local_260);
      std::__cxx11::string::~string((string *)local_d8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    }
    else {
      this_local = (WorldShuffler *)0x0;
    }
  }
  return (Item *)this_local;
}

Assistant:

Item* WorldShuffler::randomize_fortune_teller_hint()
{
    if(_options.archipelago_world())
        return nullptr;

    HintSource* fortune_teller_source = _world.hint_source("Mercator fortune teller");

    _world.add_used_hint_source(fortune_teller_source);

    // If hint source already contains text (e.g. through plando descriptor), ignore it
    if(!fortune_teller_source->text().empty())
        return nullptr;

    std::vector<uint8_t> hintable_items = { ITEM_GOLA_EYE, ITEM_GOLA_NAIL, ITEM_GOLA_FANG, ITEM_GOLA_HORN };
    vectools::shuffle(hintable_items, _rng);
    
    Item* hinted_item = _world.item(*(hintable_items.begin()));

    std::string item_fancy_name;
    if (hinted_item == _world.item(ITEM_GOLA_EYE))
        item_fancy_name = "an eye";
    else if (hinted_item == _world.item(ITEM_GOLA_NAIL))
        item_fancy_name = "a nail";
    else if (hinted_item == _world.item(ITEM_GOLA_FANG))
        item_fancy_name = "a fang";
    else if (hinted_item == _world.item(ITEM_GOLA_HORN))
        item_fancy_name = "a horn";

    std::stringstream fortune_teller_hint;
    fortune_teller_hint << "\x1cI see... \x1aI see... \x1a\nI see " << item_fancy_name << " " << this->random_hint_for_item(hinted_item) << ".";
    fortune_teller_source->text(fortune_teller_hint.str());

    vectools::erase_first(_hintable_item_locations, hinted_item->id());
    return hinted_item;
}